

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void neon_store_reg64(TCGContext_conflict1 *tcg_ctx,TCGv_i64 var,int reg)

{
  tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_st_i64,(TCGArg)(var + (long)tcg_ctx),
                      (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),
                      (ulong)((uint)reg >> 1) * 0x100 + (ulong)(reg & 1) * 8 + 0xc10);
  return;
}

Assistant:

static inline long vfp_reg_offset(bool dp, unsigned reg)
{
    if (dp) {
        return offsetof(CPUARMState, vfp.zregs[reg >> 1].d[reg & 1]);
    } else {
        long ofs = offsetof(CPUARMState, vfp.zregs[reg >> 2].d[(reg >> 1) & 1]);
        if (reg & 1) {
            ofs += offsetof(CPU_DoubleU, l.upper);
        } else {
            ofs += offsetof(CPU_DoubleU, l.lower);
        }
        return ofs;
    }
}